

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O3

void tommy_hashtable_init(tommy_hashtable *hashtable,tommy_count_t bucket_max)

{
  long lVar1;
  uint uVar2;
  tommy_hashtable_node **__s;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0x10;
  if (0xf < bucket_max) {
    uVar2 = bucket_max - 1 >> 1 | bucket_max - 1;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = (uVar2 >> 0x10 | uVar2) + 1;
  }
  hashtable->bucket_max = uVar2;
  hashtable->bucket_mask = uVar2 - 1;
  __s = (tommy_hashtable_node **)lrtr_malloc((ulong)uVar2 << 3);
  hashtable->bucket = __s;
  memset(__s,0,(ulong)hashtable->bucket_max << 3);
  hashtable->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashtable_init(tommy_hashtable* hashtable, tommy_count_t bucket_max)
{
	if (bucket_max < 16)
		bucket_max = 16;
	else
		bucket_max = tommy_roundup_pow2_u32(bucket_max);

	hashtable->bucket_max = bucket_max;
	hashtable->bucket_mask = hashtable->bucket_max - 1;

	/* initialize the vector using malloc()+memset() instead of calloc() */
	/* to ensure that all the memory in really allocated immediately */
	/* by the OS, and not deferred at later time. */
	/* this improves performance, because we start with a fully initialized hashtable. */
	hashtable->bucket = tommy_cast(tommy_hashtable_node**, tommy_malloc(hashtable->bucket_max * sizeof(tommy_hashtable_node*)));
	memset(hashtable->bucket, 0, hashtable->bucket_max * sizeof(tommy_hashtable_node*));

	hashtable->count = 0;
}